

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

quat quat_slerp(quat v0,quat v1,float a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  quat qVar5;
  quat qVar6;
  quat q1;
  undefined8 local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 local_28;
  
  qVar5 = quat_normalize(v0);
  uStack_44 = qVar5.w;
  qVar6 = quat_normalize(v1);
  local_38 = qVar5.x;
  uStack_34 = qVar5.y;
  local_48 = qVar5.z;
  fVar4 = qVar6.w * uStack_44 + local_48 * qVar6.z + local_38 * qVar6.x + uStack_34 * qVar6.y;
  if (ABS(fVar4) <= 0.95) {
    if (0.0 <= fVar4) {
      local_68 = qVar6._8_8_;
      local_28 = qVar6._0_8_;
    }
    else {
      qVar6 = quat_scale(qVar6,-1.0);
      local_28 = qVar6._0_8_;
      local_68 = qVar6._8_8_;
      fVar4 = -fVar4;
    }
    if (fVar4 <= -1.0) {
      fVar4 = -1.0;
    }
    if (1.0 <= fVar4) {
      fVar4 = 1.0;
    }
    fVar4 = acosf(fVar4);
    qVar6 = quat_scale(qVar5,a);
    q1.z = (float)(undefined4)local_68;
    q1.w = (float)local_68._4_4_;
    q1.x = (float)(undefined4)local_28;
    q1.y = (float)local_28._4_4_;
    qVar6 = quat_subtract(q1,qVar6);
    qVar6 = quat_normalize(qVar6);
    fVar1 = cosf(fVar4 * a);
    qVar5 = quat_scale(qVar5,fVar1);
    fVar4 = sinf(fVar4 * a);
    qVar6 = quat_scale(qVar6,fVar4);
    fVar2 = qVar6.z;
    fVar3 = qVar6.w;
    fVar4 = qVar6.x;
    fVar1 = qVar6.y;
    local_38 = qVar5.x;
    uStack_34 = qVar5.y;
    local_48 = qVar5.z;
    uStack_44 = qVar5.w;
  }
  else {
    qVar5 = quat_subtract(qVar6,qVar5);
    qVar5 = quat_scale(qVar5,a);
    fVar2 = qVar5.z;
    fVar3 = qVar5.w;
    fVar4 = qVar5.x;
    fVar1 = qVar5.y;
  }
  qVar5.y = uStack_34;
  qVar5.x = local_38;
  qVar5.w = uStack_44;
  qVar5.z = local_48;
  qVar6.y = fVar1;
  qVar6.x = fVar4;
  qVar6.w = fVar3;
  qVar6.z = fVar2;
  qVar5 = quat_add(qVar5,qVar6);
  return qVar5;
}

Assistant:

quat quat_slerp(quat v0, quat v1, float a) {
    v0 = quat_normalize(v0);
    v1 = quat_normalize(v1);

    float dot = quat_dot(v0, v1);
    if (fabs(dot) > 0.95f) {
        return quat_add(v0, quat_scale(quat_subtract(v1, v0), a));
    }

    if (dot < 0.0f) {
        v1 = quat_scale(v1, -1.0f);
        dot = -dot;
    }

    dot = fminf(fmaxf(-1.0f, dot), 1.0f);
    float theta_0 = acosf(dot);
    float theta = theta_0 * a;

    quat v2 = quat_subtract(v1, quat_scale(v0, a));
    v2 = quat_normalize(v2);

    return quat_add(quat_scale(v0, cosf(theta)), quat_scale(v2, sinf(theta)));
}